

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu510.c
# Opt level: O1

MPP_RET hal_h265e_v510_init(void *hal,MppEncHalCfg *cfg)

{
  MppEncCfgSet *pMVar1;
  MPP_RET MVar2;
  undefined8 in_RAX;
  void *pvVar3;
  void *pvVar4;
  undefined8 *puVar5;
  char *fname;
  char *fmt;
  long lVar6;
  int iVar7;
  ulong uVar8;
  undefined4 uVar9;
  
  uVar9 = (undefined4)((ulong)in_RAX >> 0x20);
  mpp_env_get_u32("hal_h265e_debug",&hal_h265e_debug,0);
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","(%d) enter\n",(char *)0x0,0x457);
  }
  iVar7 = cfg->task_cnt;
  *(int *)((long)hal + 0xb4) = iVar7;
  if ((iVar7 == 0 || 2 < iVar7) &&
     (_mpp_log_l(2,"hal_h265e_v510","Assertion %s failed at %s:%d\n",(char *)0x0,
                 "ctx->task_cnt && ctx->task_cnt <= 2","hal_h265e_v510_init",CONCAT44(uVar9,0x45a)),
     (mpp_debug._3_1_ & 0x10) != 0)) {
    abort();
  }
  if (2 < *(int *)((long)hal + 0xb4)) {
    *(undefined4 *)((long)hal + 0xb4) = 2;
  }
  if (0 < *(int *)((long)hal + 0xb4)) {
    lVar6 = 0;
    do {
      pvVar3 = mpp_osal_calloc("hal_h265e_v510_init",0x1d0);
      pvVar4 = mpp_osal_calloc("hal_h265e_v510_init",0xcb4);
      *(void **)((long)pvVar3 + 0x18) = pvVar4;
      pvVar4 = mpp_osal_calloc("hal_h265e_v510_init",0x254);
      *(void **)((long)pvVar3 + 0x20) = pvVar4;
      *(undefined4 *)((long)pvVar3 + 4) = 2;
      *(void **)((long)hal + lVar6 * 8 + 0x80) = pvVar3;
      lVar6 = lVar6 + 1;
    } while (lVar6 < *(int *)((long)hal + 0xb4));
  }
  pvVar3 = mpp_osal_calloc("hal_h265e_v510_init",0x28);
  *(void **)((long)hal + 0x3c0) = pvVar3;
  *(MppEncCfgSet **)((long)hal + 0x390) = cfg->cfg;
  hal_bufs_init((HalBufs *)((long)hal + 0x3e0));
  *(undefined4 *)((long)hal + 0xb0) = 0xffffffff;
  *(undefined4 *)((long)hal + 0x370) = 0;
  *(undefined4 *)((long)hal + 0x3b0) = 1;
  cfg->cap_recn_out = 1;
  cfg->type = VPU_CLIENT_RKVENC;
  MVar2 = mpp_dev_init(&cfg->dev,VPU_CLIENT_RKVENC);
  if (MVar2 == MPP_OK) {
    mpp_dev_multi_offset_init((MppDevRegOffCfgs **)((long)hal + 0x398),0x18);
    *(MppDev *)((long)hal + 0x68) = cfg->dev;
    *(undefined4 *)((long)hal + 0x374) = 2;
    pMVar1 = cfg->cfg;
    (pMVar1->hw).qp_delta_row = 2;
    (pMVar1->hw).qp_delta_row_i = 2;
    (pMVar1->hw).qbias_i = 0xab;
    (pMVar1->hw).qbias_p = 0x55;
    (pMVar1->hw).qbias_en = 0;
    lVar6 = 0;
    do {
      (pMVar1->hw).mode_bias[lVar6] = 8;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 8);
    *(undefined8 *)((long)hal + 0x98) = 0x5000000008;
    pvVar3 = mpp_osal_malloc("hal_h265e_v510_init",0x50);
    *(void **)((long)hal + 0xa0) = pvVar3;
    if (pvVar3 == (void *)0x0) {
      _mpp_log_l(2,"hal_h265e_v510","init poll cfg buffer failed\n","hal_h265e_v510_init");
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      *(MppCbCtx **)((long)hal + 0xa8) = cfg->output_cb;
      cfg->cap_recn_out = 1;
      puVar5 = (undefined8 *)mpp_osal_calloc("vepu510_h265e_tune_init",0x28);
      if (puVar5 != (undefined8 *)0x0) {
        *puVar5 = hal;
        *(undefined4 *)((long)puVar5 + 0x14) = 0xffffffff;
        *(undefined4 *)(puVar5 + 3) = 0xffffffff;
        *(undefined4 *)((long)puVar5 + 0x1c) = 0xffffffff;
        *(undefined4 *)(puVar5 + 4) = 0xffffffff;
      }
      *(undefined8 **)((long)hal + 0x428) = puVar5;
      MVar2 = MPP_OK;
    }
    if (pvVar3 == (void *)0x0) {
      hal_h265e_v510_deinit(hal);
    }
    if (((byte)hal_h265e_debug & 4) == 0) {
      return MVar2;
    }
    fmt = "(%d) leave\n";
    iVar7 = 4;
    fname = (char *)0x0;
    uVar8 = 0x49a;
  }
  else {
    fmt = "mpp_dev_init failed. ret: %d\n";
    fname = "hal_h265e_v510_init";
    iVar7 = 2;
    uVar8 = (ulong)(uint)MVar2;
  }
  _mpp_log_l(iVar7,"hal_h265e_v510",fmt,fname,uVar8);
  return MVar2;
}

Assistant:

MPP_RET hal_h265e_v510_init(void *hal, MppEncHalCfg *cfg)
{
    MPP_RET ret = MPP_OK;
    H265eV510HalContext *ctx = (H265eV510HalContext *)hal;
    RK_S32 i = 0;

    mpp_env_get_u32("hal_h265e_debug", &hal_h265e_debug, 0);
    hal_h265e_enter();

    ctx->task_cnt = cfg->task_cnt;
    mpp_assert(ctx->task_cnt && ctx->task_cnt <= MAX_FRAME_TASK_NUM);
    if (ctx->task_cnt > MAX_FRAME_TASK_NUM)
        ctx->task_cnt = MAX_FRAME_TASK_NUM;

    for (i = 0; i < ctx->task_cnt; i++) {
        Vepu510H265eFrmCfg *frm_cfg = mpp_calloc(Vepu510H265eFrmCfg, 1);

        frm_cfg->regs_set = mpp_calloc(H265eV510RegSet, 1);
        frm_cfg->regs_ret = mpp_calloc(H265eV510StatusElem, 1);
        frm_cfg->frame_type = INTRA_FRAME;
        ctx->frms[i] = frm_cfg;
    }

    ctx->input_fmt      = mpp_calloc(VepuFmtCfg, 1);
    ctx->cfg            = cfg->cfg;
    hal_bufs_init(&ctx->dpb_bufs);

    ctx->frame_count = -1;
    ctx->frame_cnt_gen_ready = 0;
    ctx->enc_mode = 1;
    cfg->cap_recn_out = 1;
    cfg->type = VPU_CLIENT_RKVENC;
    ret = mpp_dev_init(&cfg->dev, cfg->type);
    if (ret) {
        mpp_err_f("mpp_dev_init failed. ret: %d\n", ret);
        return ret;
    }
    mpp_dev_multi_offset_init(&ctx->reg_cfg, 24);
    ctx->dev = cfg->dev;
    ctx->frame_type = INTRA_FRAME;

    {   /* setup default hardware config */
        MppEncHwCfg *hw = &cfg->cfg->hw;
        RK_U32 j;

        hw->qp_delta_row_i  = 2;
        hw->qp_delta_row    = 2;
        hw->qbias_i         = 171;
        hw->qbias_p         = 85;
        hw->qbias_en        = 0;

        for (j = 0; j < MPP_ARRAY_ELEMS(hw->mode_bias); j++)
            hw->mode_bias[j] = 8;
    }

    ctx->poll_slice_max = 8;
    ctx->poll_cfg_size = (sizeof(ctx->poll_cfgs) + sizeof(RK_S32) * ctx->poll_slice_max) * 2;
    ctx->poll_cfgs = mpp_malloc_size(MppDevPollCfg, ctx->poll_cfg_size);

    if (NULL == ctx->poll_cfgs) {
        ret = MPP_ERR_MALLOC;
        mpp_err_f("init poll cfg buffer failed\n");
        goto DONE;
    }

    ctx->output_cb = cfg->output_cb;
    cfg->cap_recn_out = 1;

    ctx->tune = vepu510_h265e_tune_init(ctx);

DONE:
    if (ret)
        hal_h265e_v510_deinit(hal);

    hal_h265e_leave();
    return ret;
}